

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void jmp_list_append(Parser *psr,int *head,int to_add)

{
  if (*head != -1) {
    jmp_set_target(psr,to_add,*head);
    *head = to_add;
    return;
  }
  *head = to_add;
  jmp_set_target(psr,to_add,-1);
  return;
}

Assistant:

static void jmp_list_append(Parser *psr, int *head, int to_add) {
	if (*head == -1) {
		// Nothing in the jump list yet; set the head
		*head = to_add;

		// Reset the target of the jump to add, in case it was pointing to
		// something else previously
		jmp_set_target(psr, to_add, -1);
	} else {
		jmp_set_target(psr, to_add, *head);
		*head = to_add;
	}
}